

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O1

Constant *
spvtools::opt::anon_unknown_0::FoldScalarSConvert
          (Type *result_type,Constant *a,ConstantManager *const_mgr)

{
  int iVar1;
  undefined4 extraout_var;
  uint64_t result;
  Constant *pCVar2;
  
  if (result_type == (Type *)0x0) {
    __assert_fail("result_type != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/const_folding_rules.cpp"
                  ,0x699,
                  "const analysis::Constant *spvtools::opt::(anonymous namespace)::FoldScalarSConvert(const analysis::Type *, const analysis::Constant *, analysis::ConstantManager *)"
                 );
  }
  if (a == (Constant *)0x0) {
    __assert_fail("a != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/const_folding_rules.cpp"
                  ,0x69a,
                  "const analysis::Constant *spvtools::opt::(anonymous namespace)::FoldScalarSConvert(const analysis::Type *, const analysis::Constant *, analysis::ConstantManager *)"
                 );
  }
  if (const_mgr == (ConstantManager *)0x0) {
    __assert_fail("const_mgr != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/const_folding_rules.cpp"
                  ,0x69b,
                  "const analysis::Constant *spvtools::opt::(anonymous namespace)::FoldScalarSConvert(const analysis::Type *, const analysis::Constant *, analysis::ConstantManager *)"
                 );
  }
  iVar1 = (*result_type->_vptr_Type[10])();
  if ((Integer *)CONCAT44(extraout_var,iVar1) != (Integer *)0x0) {
    result = analysis::Constant::GetSignExtendedValue(a);
    pCVar2 = analysis::ConstantManager::GenerateIntegerConstant
                       (const_mgr,(Integer *)CONCAT44(extraout_var,iVar1),result);
    return pCVar2;
  }
  __assert_fail("integer_type && \"The result type of an SConvert\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/const_folding_rules.cpp"
                ,0x69d,
                "const analysis::Constant *spvtools::opt::(anonymous namespace)::FoldScalarSConvert(const analysis::Type *, const analysis::Constant *, analysis::ConstantManager *)"
               );
}

Assistant:

const analysis::Constant* FoldScalarSConvert(
    const analysis::Type* result_type, const analysis::Constant* a,
    analysis::ConstantManager* const_mgr) {
  assert(result_type != nullptr);
  assert(a != nullptr);
  assert(const_mgr != nullptr);
  const analysis::Integer* integer_type = result_type->AsInteger();
  assert(integer_type && "The result type of an SConvert");
  int64_t value = a->GetSignExtendedValue();
  return const_mgr->GenerateIntegerConstant(integer_type, value);
}